

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void * stbi__load_gif_main(stbi__context *s,int **delays,int *x,int *y,int *z,int *comp,int req_comp
                          )

{
  int iVar1;
  uint uVar2;
  int iVar3;
  stbi_uc *out_00;
  void *pvVar4;
  int *piVar5;
  int *new_delays;
  void *tmp;
  int delays_size;
  int out_size;
  int stride;
  stbi__gif g;
  stbi_uc *two_back;
  stbi_uc *out;
  stbi_uc *u;
  int layers;
  int *comp_local;
  int *z_local;
  int *y_local;
  int *x_local;
  int **delays_local;
  stbi__context *s_local;
  
  iVar1 = stbi__gif_test(s);
  if (iVar1 == 0) {
    stbi__err("Image was not as a gif type.");
    s_local = (stbi__context *)0x0;
  }
  else {
    u._4_4_ = 0;
    two_back = (stbi_uc *)0x0;
    g.delay = 0;
    g._34924_4_ = 0;
    memset(&out_size,0,0x8870);
    if (delays != (int **)0x0) {
      *delays = (int *)0x0;
    }
    do {
      out = stbi__gif_load_next(s,(stbi__gif *)&out_size,comp,req_comp,(stbi_uc *)g._34920_8_);
      if ((stbi__context *)out == s) {
        out = (stbi_uc *)0x0;
      }
      uVar2 = u._4_4_;
      if (out != (stbi_uc *)0x0) {
        *x = out_size;
        *y = stride;
        uVar2 = u._4_4_ + 1;
        iVar1 = out_size * stride;
        iVar3 = iVar1 * 4;
        if (two_back == (stbi_uc *)0x0) {
          two_back = (stbi_uc *)stbi__malloc((long)(int)(uVar2 * iVar3));
          if (two_back == (stbi_uc *)0x0) {
            pvVar4 = stbi__load_gif_main_outofmem((stbi__gif *)&out_size,(stbi_uc *)0x0,delays);
            return pvVar4;
          }
          if (delays != (int **)0x0) {
            piVar5 = (int *)stbi__malloc((long)(int)uVar2 << 2);
            *delays = piVar5;
            if (*delays == (int *)0x0) {
              pvVar4 = stbi__load_gif_main_outofmem((stbi__gif *)&out_size,two_back,delays);
              return pvVar4;
            }
          }
        }
        else {
          out_00 = (stbi_uc *)realloc(two_back,(long)(int)(uVar2 * iVar3));
          if (out_00 == (stbi_uc *)0x0) {
            pvVar4 = stbi__load_gif_main_outofmem((stbi__gif *)&out_size,two_back,delays);
            return pvVar4;
          }
          two_back = out_00;
          if (delays != (int **)0x0) {
            piVar5 = (int *)realloc(*delays,(long)(int)uVar2 << 2);
            if (piVar5 == (int *)0x0) {
              pvVar4 = stbi__load_gif_main_outofmem((stbi__gif *)&out_size,out_00,delays);
              return pvVar4;
            }
            *delays = piVar5;
          }
        }
        memcpy(two_back + (int)(u._4_4_ * iVar3),out,(long)iVar3);
        if (1 < (int)uVar2) {
          g._34920_8_ = (long)two_back - (long)(iVar1 * 8);
        }
        if (delays != (int **)0x0) {
          (*delays)[u._4_4_] = g.cur_y;
        }
      }
      u._4_4_ = uVar2;
    } while (out != (stbi_uc *)0x0);
    free((void *)g._0_8_);
    free(g.background);
    free(g.out);
    if ((req_comp != 0) && (req_comp != 4)) {
      two_back = stbi__convert_format(two_back,4,req_comp,u._4_4_ * out_size,stride);
    }
    *z = u._4_4_;
    s_local = (stbi__context *)two_back;
  }
  return s_local;
}

Assistant:

static void *stbi__load_gif_main(stbi__context *s, int **delays, int *x, int *y, int *z, int *comp, int req_comp)
{
   if (stbi__gif_test(s)) {
      int layers = 0;
      stbi_uc *u = 0;
      stbi_uc *out = 0;
      stbi_uc *two_back = 0;
      stbi__gif g;
      int stride;
      int out_size = 0;
      int delays_size = 0;

      STBI_NOTUSED(out_size);
      STBI_NOTUSED(delays_size);

      memset(&g, 0, sizeof(g));
      if (delays) {
         *delays = 0;
      }

      do {
         u = stbi__gif_load_next(s, &g, comp, req_comp, two_back);
         if (u == (stbi_uc *) s) u = 0;  // end of animated gif marker

         if (u) {
            *x = g.w;
            *y = g.h;
            ++layers;
            stride = g.w * g.h * 4;

            if (out) {
               void *tmp = (stbi_uc*) STBI_REALLOC_SIZED( out, out_size, layers * stride );
               if (!tmp)
                  return stbi__load_gif_main_outofmem(&g, out, delays);
               else {
                   out = (stbi_uc*) tmp;
                   out_size = layers * stride;
               }

               if (delays) {
                  int *new_delays = (int*) STBI_REALLOC_SIZED( *delays, delays_size, sizeof(int) * layers );
                  if (!new_delays)
                     return stbi__load_gif_main_outofmem(&g, out, delays);
                  *delays = new_delays;
                  delays_size = layers * sizeof(int);
               }
            } else {
               out = (stbi_uc*)stbi__malloc( layers * stride );
               if (!out)
                  return stbi__load_gif_main_outofmem(&g, out, delays);
               out_size = layers * stride;
               if (delays) {
                  *delays = (int*) stbi__malloc( layers * sizeof(int) );
                  if (!*delays)
                     return stbi__load_gif_main_outofmem(&g, out, delays);
                  delays_size = layers * sizeof(int);
               }
            }
            memcpy( out + ((layers - 1) * stride), u, stride );
            if (layers >= 2) {
               two_back = out - 2 * stride;
            }

            if (delays) {
               (*delays)[layers - 1U] = g.delay;
            }
         }
      } while (u != 0);

      // free temp buffer;
      STBI_FREE(g.out);
      STBI_FREE(g.history);
      STBI_FREE(g.background);

      // do the final conversion after loading everything;
      if (req_comp && req_comp != 4)
         out = stbi__convert_format(out, 4, req_comp, layers * g.w, g.h);

      *z = layers;
      return out;
   } else {
      return stbi__errpuc("not GIF", "Image was not as a gif type.");
   }
}